

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

int __thiscall ON_Layer::UpdateViewportIds(ON_Layer *this,ON_UuidPairList *viewport_id_map)

{
  ON__LayerPerViewSettings *pOVar1;
  bool bVar2;
  int iVar3;
  ON__LayerExtensions *pOVar4;
  int i;
  long lVar5;
  ON_UUID_struct *a;
  long lVar6;
  ON_UUID id1;
  ON_UUID new_id;
  int local_44;
  ON_UUID local_40;
  
  iVar3 = ON_UuidPairList::Count(viewport_id_map);
  if (iVar3 < 1) {
    local_44 = 0;
  }
  else {
    local_44 = 0;
    pOVar4 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    if (pOVar4 != (ON__LayerExtensions *)0x0) {
      lVar6 = 0;
      local_44 = 0;
      for (lVar5 = 0; lVar5 < (pOVar4->m_vp_settings).m_count; lVar5 = lVar5 + 1) {
        pOVar1 = (pOVar4->m_vp_settings).m_a;
        id1.Data4 = *(uchar (*) [8])((pOVar1->m_viewport_id).Data4 + lVar6);
        id1._0_8_ = *(undefined8 *)((pOVar1->m_viewport_id).Data4 + lVar6 + -8);
        bVar2 = ON_UuidPairList::FindId1(viewport_id_map,id1,&local_40);
        if (bVar2) {
          a = (ON_UUID_struct *)((pOVar1->m_viewport_id).Data4 + lVar6 + -8);
          bVar2 = ::operator!=(a,&local_40);
          if (bVar2) {
            a->Data1 = local_40.Data1;
            a->Data2 = local_40.Data2;
            a->Data3 = local_40.Data3;
            *&a->Data4 = local_40.Data4;
            local_44 = local_44 + 1;
          }
        }
        lVar6 = lVar6 + 0x28;
      }
    }
  }
  return local_44;
}

Assistant:

int ON_Layer::UpdateViewportIds( const ON_UuidPairList& viewport_id_map )
{
  if ( viewport_id_map.Count() <= 0 )
    return 0;
  ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 == ud )
    return 0;
  int rc = 0;
  ON_UUID new_id;
  for ( int i = 0; i < ud->m_vp_settings.Count(); i++ )
  {
    ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
    if ( viewport_id_map.FindId1(s.m_viewport_id,&new_id) && s.m_viewport_id != new_id )
    {
      s.m_viewport_id = new_id;
      rc++;
    }
  }
  return rc;
}